

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

Iterator * leveldb::Table::BlockReader(void *arg,ReadOptions *options,Slice *index_value)

{
  long *arg1;
  uint64_t uVar1;
  Iterator *this;
  void *arg2;
  Block *this_00;
  long in_FS_OFFSET;
  Slice key;
  Status s;
  Slice input;
  BlockHandle handle;
  BlockContents contents;
  char cache_key_buffer [16];
  char *local_a8;
  char **local_a0;
  undefined8 local_98;
  BlockHandle local_90;
  size_t sStack_80;
  Slice local_78;
  BlockContents local_60;
  char *local_48;
  undefined8 local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  arg1 = *(long **)(*arg + 0x30);
  local_78.data_._0_4_ = 0xffffffff;
  local_78.data_._4_4_ = 0xffffffff;
  local_78.size_._0_4_ = 0xffffffff;
  local_78.size_._4_4_ = 0xffffffff;
  local_90.size_ = (uint64_t)index_value->data_;
  sStack_80 = index_value->size_;
  BlockHandle::DecodeFrom(&local_90,&local_78);
  if ((char *)local_90.offset_ == (char *)0x0) {
    local_60.data.data_ = "";
    local_60.data.size_ = 0;
    if (arg1 == (long *)0x0) {
      ReadBlock((leveldb *)&local_48,*(RandomAccessFile **)(*arg + 0x68),options,
                (BlockHandle *)&local_78,&local_60);
      uVar1 = local_90.offset_;
      local_90.offset_ = (uint64_t)local_48;
      local_48 = (char *)uVar1;
      if ((char *)uVar1 != (char *)0x0) {
        operator_delete__((void *)uVar1);
      }
      if ((char *)local_90.offset_ != (char *)0x0) goto LAB_0065ea88;
      this_00 = (Block *)operator_new(0x18);
      Block::Block(this_00,&local_60);
    }
    else {
      local_48 = *(char **)(*arg + 0x70);
      local_a0 = &local_48;
      local_40 = CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_);
      local_98 = 0x10;
      arg2 = (void *)(**(code **)(*arg1 + 0x18))(arg1);
      if (arg2 != (void *)0x0) {
        this_00 = (Block *)(**(code **)(*arg1 + 0x28))(arg1,arg2);
        goto LAB_0065ea8e;
      }
      ReadBlock((leveldb *)&local_a8,*(RandomAccessFile **)(*arg + 0x68),options,
                (BlockHandle *)&local_78,&local_60);
      uVar1 = local_90.offset_;
      local_90.offset_ = (uint64_t)local_a8;
      local_a8 = (char *)uVar1;
      if ((char *)uVar1 != (char *)0x0) {
        operator_delete__((void *)uVar1);
      }
      if ((char *)local_90.offset_ != (char *)0x0) goto LAB_0065ea88;
      this_00 = (Block *)operator_new(0x18);
      Block::Block(this_00,&local_60);
      if ((local_60.cachable == true) && (options->fill_cache == true)) {
        arg2 = (void *)(**(code **)(*arg1 + 0x10))
                                 (arg1,&local_a0,this_00,this_00->size_,DeleteCachedBlock);
        goto LAB_0065ea8e;
      }
    }
  }
  else {
LAB_0065ea88:
    this_00 = (Block *)0x0;
  }
  arg2 = (void *)0x0;
LAB_0065ea8e:
  if (this_00 == (Block *)0x0) {
    this = NewErrorIterator((Status *)&local_90);
  }
  else {
    this = Block::NewIterator(this_00,(Comparator *)**arg);
    if (arg2 == (void *)0x0) {
      Iterator::RegisterCleanup(this,DeleteBlock,this_00,(void *)0x0);
    }
    else {
      Iterator::RegisterCleanup(this,ReleaseBlock,arg1,arg2);
    }
  }
  if ((char *)local_90.offset_ != (char *)0x0) {
    operator_delete__((void *)local_90.offset_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* Table::BlockReader(void* arg, const ReadOptions& options,
                             const Slice& index_value) {
  Table* table = reinterpret_cast<Table*>(arg);
  Cache* block_cache = table->rep_->options.block_cache;
  Block* block = nullptr;
  Cache::Handle* cache_handle = nullptr;

  BlockHandle handle;
  Slice input = index_value;
  Status s = handle.DecodeFrom(&input);
  // We intentionally allow extra stuff in index_value so that we
  // can add more features in the future.

  if (s.ok()) {
    BlockContents contents;
    if (block_cache != nullptr) {
      char cache_key_buffer[16];
      EncodeFixed64(cache_key_buffer, table->rep_->cache_id);
      EncodeFixed64(cache_key_buffer + 8, handle.offset());
      Slice key(cache_key_buffer, sizeof(cache_key_buffer));
      cache_handle = block_cache->Lookup(key);
      if (cache_handle != nullptr) {
        block = reinterpret_cast<Block*>(block_cache->Value(cache_handle));
      } else {
        s = ReadBlock(table->rep_->file, options, handle, &contents);
        if (s.ok()) {
          block = new Block(contents);
          if (contents.cachable && options.fill_cache) {
            cache_handle = block_cache->Insert(key, block, block->size(),
                                               &DeleteCachedBlock);
          }
        }
      }
    } else {
      s = ReadBlock(table->rep_->file, options, handle, &contents);
      if (s.ok()) {
        block = new Block(contents);
      }
    }
  }

  Iterator* iter;
  if (block != nullptr) {
    iter = block->NewIterator(table->rep_->options.comparator);
    if (cache_handle == nullptr) {
      iter->RegisterCleanup(&DeleteBlock, block, nullptr);
    } else {
      iter->RegisterCleanup(&ReleaseBlock, block_cache, cache_handle);
    }
  } else {
    iter = NewErrorIterator(s);
  }
  return iter;
}